

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O3

shared_ptr<Pipeline> __thiscall QPDFLogger::getWarn(QPDFLogger *this,bool null_okay)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined7 in_register_00000031;
  shared_ptr<Pipeline> sVar4;
  
  lVar1 = *(long *)CONCAT71(in_register_00000031,null_okay);
  peVar2 = *(element_type **)(lVar1 + 0x50);
  if (peVar2 == (element_type *)0x0) {
    sVar4 = getError(this,null_okay);
    in_RDX = sVar4.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x58);
    (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
  }
  sVar4.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar4.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar4.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::getWarn(bool null_okay)
{
    if (m->p_warn) {
        return m->p_warn;
    }
    return getError(null_okay);
}